

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_server.h
# Opt level: O1

void __thiscall
rest_rpc::rpc_service::rpc_server::publish<person>
          (rpc_server *this,string *key,string *token,person *data)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  size_type sVar3;
  connection *this_00;
  int iVar4;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
  _Var5;
  long *plVar6;
  size_type *psVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar8;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_false,_true>_>
  pVar9;
  unique_lock<std::mutex> lock_1;
  unique_lock<std::mutex> lock;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  shared_data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string *local_c8;
  unique_lock<std::mutex> local_c0;
  string *local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  int local_80;
  size_type *local_78;
  service_type *local_70;
  size_type local_68;
  per_descriptor_data pdStack_60;
  protocol_type local_58;
  undefined1 local_50 [24];
  object_fns *local_38;
  
  local_e8._M_string_length = local_e8._M_string_length & 0xffffffffffffff00;
  local_e8._M_dataplus._M_p = (pointer)&this->sub_mtx_;
  local_c8 = key;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_e8);
  local_e8._M_string_length = CONCAT71(local_e8._M_string_length._1_7_,1);
  sVar3 = (this->sub_map_)._M_h._M_element_count;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_e8);
  if (sVar3 != 0) {
    local_80 = data->id;
    local_78 = (size_type *)(data->name)._M_dataplus._M_p;
    paVar1 = &(data->name).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78 == paVar1) {
      local_68 = paVar1->_M_allocated_capacity;
      pdStack_60 = *(per_descriptor_data *)((long)&(data->name).field_2 + 8);
      local_78 = &local_68;
    }
    else {
      local_68 = paVar1->_M_allocated_capacity;
    }
    local_70 = (service_type *)(data->name)._M_string_length;
    (data->name)._M_dataplus._M_p = (pointer)paVar1;
    (data->name)._M_string_length = 0;
    (data->name).field_2._M_local_buf[0] = '\0';
    local_58.family_ = data->age;
    get_shared_data<person>((rpc_server *)&local_b0,(person *)this);
    if (local_78 != &local_68) {
      operator_delete(local_78);
    }
    local_c0._M_owns = false;
    local_c0._M_device = &this->sub_mtx_;
    std::unique_lock<std::mutex>::lock(&local_c0);
    local_c0._M_owns = true;
    std::operator+(&local_e8,local_c8,token);
    pVar9 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
            ::equal_range(&(this->sub_map_)._M_h,&local_e8);
    _Var5._M_cur = (__node_type *)
                   pVar9.first.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
                   ._M_cur;
    paVar1 = &local_e8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    if ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
         )_Var5._M_cur ==
        pVar9.second.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
        ._M_cur.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
       ) {
      if (asio::system_category()::instance == '\0') {
        publish<person>();
      }
      std::operator+(&local_a0,"The subscriber of the key: ",local_c8);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_a0);
      psVar7 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_e8.field_2._M_allocated_capacity = *psVar7;
        local_e8.field_2._8_8_ = plVar6[3];
        local_e8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_e8.field_2._M_allocated_capacity = *psVar7;
        local_e8._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_e8._M_string_length = plVar6[1];
      *plVar6 = (long)psVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((this->err_cb_).super__Function_base._M_manager != (_Manager_type)0x0) {
        local_50._16_4_ = 0x16;
        local_38 = (object_fns *)&asio::system_category()::instance;
        local_50._0_8_ = local_e8._M_dataplus._M_p;
        local_50._8_8_ = local_e8._M_string_length;
        (*(this->err_cb_)._M_invoker)
                  ((_Any_data *)&this->err_cb_,(error_code *)(local_50 + 0x10),
                   (basic_string_view<char,_std::char_traits<char>_> *)local_50);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar1) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
    }
    else {
      do {
        this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                   ((long)&((_Var5._M_cur)->
                           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
                           ).
                           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>_>
                           ._M_storage._M_storage + 0x28);
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          iVar4 = this_01->_M_use_count;
          do {
            if (iVar4 == 0) {
              this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              break;
            }
            LOCK();
            iVar2 = this_01->_M_use_count;
            bVar8 = iVar4 == iVar2;
            if (bVar8) {
              this_01->_M_use_count = iVar4 + 1;
              iVar2 = iVar4;
            }
            iVar4 = iVar2;
            UNLOCK();
          } while (!bVar8);
        }
        if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          bVar8 = true;
        }
        else {
          bVar8 = this_01->_M_use_count == 0;
        }
        if (((!bVar8) &&
            (this_00 = *(connection **)
                        ((long)&((_Var5._M_cur)->
                                super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
                                ).
                                super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>_>
                                ._M_storage._M_storage + 0x20), this_00 != (connection *)0x0)) &&
           (this_00->has_closed_ == false)) {
          std::operator+(&local_e8,local_c8,token);
          connection::publish(this_00,&local_e8,local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p);
          }
        }
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        }
        _Var5._M_cur = (__node_type *)((_Var5._M_cur)->super__Hash_node_base)._M_nxt;
      } while ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
                )_Var5._M_cur !=
               pVar9.second.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
               ._M_cur.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
              );
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_c0);
    if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
    }
  }
  return;
}

Assistant:

void publish(std::string key, std::string token, T data) {
    {
      std::unique_lock<std::mutex> lock(sub_mtx_);
      if (sub_map_.empty())
        return;
    }

    std::shared_ptr<std::string> shared_data =
        get_shared_data<T>(std::move(data));
    std::unique_lock<std::mutex> lock(sub_mtx_);
    auto range = sub_map_.equal_range(key + token);
    if (range.first != range.second) {
      for (auto it = range.first; it != range.second; ++it) {
        auto conn = it->second.lock();
        if (conn == nullptr || conn->has_closed()) {
          continue;
        }

        conn->publish(key + token, *shared_data);
      }
    } else {
      error_callback(
          asio::error::make_error_code(asio::error::invalid_argument),
          "The subscriber of the key: " + key + " does not exist.");
    }
  }